

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerUsageHandler::handle
          (CombinedImageSamplerUsageHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t id;
  uint32_t id_00;
  size_type sVar1;
  uint32_t sampler;
  uint32_t image;
  uint32_t result_id;
  SPIRType *type;
  uint32_t *puStack_28;
  uint32_t length_local;
  uint32_t *args_local;
  CombinedImageSamplerUsageHandler *pCStack_18;
  Op opcode_local;
  CombinedImageSamplerUsageHandler *this_local;
  
  type._4_4_ = length;
  puStack_28 = args;
  args_local._4_4_ = opcode;
  pCStack_18 = this;
  if ((opcode == OpLoad) || (opcode - OpAccessChain < 3)) {
    if (length < 3) {
      return false;
    }
    add_dependency(this,args[1],args[2]);
    _image = get<spirv_cross::SPIRType>(this->compiler,*puStack_28);
    if (((_image->image).dim == DimSubpassData) &&
       (this->need_subpass_input = true, ((_image->image).ms & 1U) != 0)) {
      this->need_subpass_input_ms = true;
    }
    sVar1 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(this->dref_combined_samplers,puStack_28 + 1);
    if (sVar1 != 0) {
      add_hierarchy_to_comparison_ids(this,puStack_28[1]);
    }
  }
  else if (opcode == OpSampledImage) {
    if (length < 4) {
      return false;
    }
    sampler = args[1];
    id = args[2];
    id_00 = args[3];
    sVar1 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(this->dref_combined_samplers,&sampler);
    if (sVar1 != 0) {
      add_hierarchy_to_comparison_ids(this,id);
      add_hierarchy_to_comparison_ids(this,id_00);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&this->comparison_ids,&sampler);
    }
    return true;
  }
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerUsageHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	{
		if (length < 3)
			return false;

		add_dependency(args[1], args[2]);

		// Ideally defer this to OpImageRead, but then we'd need to track loaded IDs.
		// If we load an image, we're going to use it and there is little harm in declaring an unused gl_FragCoord.
		auto &type = compiler.get<SPIRType>(args[0]);
		if (type.image.dim == DimSubpassData)
		{
			need_subpass_input = true;
			if (type.image.ms)
				need_subpass_input_ms = true;
		}

		// If we load a SampledImage and it will be used with Dref, propagate the state up.
		if (dref_combined_samplers.count(args[1]) != 0)
			add_hierarchy_to_comparison_ids(args[1]);
		break;
	}

	case OpSampledImage:
	{
		if (length < 4)
			return false;

		// If the underlying resource has been used for comparison then duplicate loads of that resource must be too.
		// This image must be a depth image.
		uint32_t result_id = args[1];
		uint32_t image = args[2];
		uint32_t sampler = args[3];

		if (dref_combined_samplers.count(result_id) != 0)
		{
			add_hierarchy_to_comparison_ids(image);

			// This sampler must be a SamplerComparisonState, and not a regular SamplerState.
			add_hierarchy_to_comparison_ids(sampler);

			// Mark the OpSampledImage itself as being comparison state.
			comparison_ids.insert(result_id);
		}
		return true;
	}

	default:
		break;
	}

	return true;
}